

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QVariant * __thiscall
QWidgetTextControl::inputMethodQuery
          (QVariant *__return_storage_ptr__,QWidgetTextControl *this,InputMethodQuery property,
          QVariant argument)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool *in_RCX;
  int iVar7;
  long lVar8;
  QWidgetTextControlPrivate *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  Data *in_XMM1_Qa;
  QStringView QVar9;
  QArrayDataPointer<char16_t> local_f8;
  QTextCursor tmpCursor;
  QRectF local_d8;
  QRectF local_b8;
  undefined1 local_88 [32];
  QArrayDataPointer<char16_t> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  if (property == ImAnchorRectangle) {
    iVar5 = QTextCursor::anchor();
    QWidgetTextControlPrivate::rectForPosition(&local_d8,this_00,iVar5);
LAB_00481bfe:
    ::QVariant::QVariant(__return_storage_ptr__,(QRectF *)this_00);
    goto LAB_00482047;
  }
  if (property == ImFont) {
    QTextCursor::charFormat();
    QTextCharFormat::font();
    QFont::operator_cast_to_QVariant(__return_storage_ptr__,(QFont *)local_88);
    QFont::~QFont((QFont *)local_88);
    QTextFormat::~QTextFormat((QTextFormat *)&local_68);
    goto LAB_00482047;
  }
  if (property == ImCursorPosition) {
    local_88._0_8_ = ::QVariant::toPointF();
    local_88._8_8_ = in_XMM1_Qa;
    if (((((double)local_88._0_8_ == 0.0) && (!NAN((double)local_88._0_8_))) &&
        ((double)in_XMM1_Qa == 0.0)) && (!NAN((double)in_XMM1_Qa))) {
      iVar5 = QTextCursor::position();
LAB_00481fb4:
      iVar6 = QTextBlock::position();
      iVar5 = iVar5 - iVar6;
LAB_00481fca:
      ::QVariant::QVariant(__return_storage_ptr__,iVar5);
      goto LAB_00482047;
    }
    cursorForPosition((QWidgetTextControl *)&local_68,(QPointF *)this);
    iVar5 = QTextCursor::position();
    iVar6 = QTextBlock::position();
    iVar5 = iVar5 - iVar6;
LAB_0048203a:
    this_01 = &local_68;
    ::QVariant::QVariant(__return_storage_ptr__,iVar5);
LAB_00482042:
    QTextCursor::~QTextCursor((QTextCursor *)this_01);
  }
  else {
    if (property == ImSurroundingText) {
      QTextBlock::text();
    }
    else {
      if (property != ImCurrentSelection) {
        if (property == ImMaximumTextLength) {
LAB_00481ae1:
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
          goto LAB_00482047;
        }
        if (property == ImAnchorPosition) {
          iVar5 = QTextCursor::anchor();
          goto LAB_00481fb4;
        }
        if (property == ImAbsolutePosition) {
          local_88._0_8_ = ::QVariant::toPointF();
          local_88._8_8_ = in_XMM1_Qa;
          if ((((double)local_88._0_8_ != 0.0) || (NAN((double)local_88._0_8_))) ||
             (((double)in_XMM1_Qa != 0.0 || (NAN((double)in_XMM1_Qa))))) {
            cursorForPosition((QWidgetTextControl *)&local_68,(QPointF *)this);
            iVar5 = QTextCursor::position();
            goto LAB_0048203a;
          }
          iVar5 = QTextCursor::position();
          goto LAB_00481fca;
        }
        if (property == ImTextBeforeCursor) {
          iVar5 = 0x400;
          if (3 < *(ulong *)(in_RCX + 0x18)) {
            iVar5 = ::QVariant::toInt(in_RCX);
          }
          _tmpCursor = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor(&tmpCursor,&this_00->cursor);
          iVar1 = QTextCursor::position();
          iVar2 = QTextBlock::position();
          iVar7 = 0;
          for (iVar6 = iVar1 - iVar2; iVar6 < iVar5; iVar6 = iVar6 + iVar3) {
            iVar3 = QTextCursor::blockNumber();
            QTextCursor::movePosition((MoveOperation)&tmpCursor,6,0);
            iVar4 = QTextCursor::blockNumber();
            if (iVar4 == iVar3) break;
            QTextCursor::block();
            iVar3 = QTextBlock::length();
            iVar7 = iVar7 + -1;
          }
          local_68.size = 0;
          local_68.d = (Data *)0x0;
          local_68.ptr = (char16_t *)0x0;
          for (; iVar7 != 0; iVar7 = iVar7 + 1) {
            QTextCursor::block();
            QTextBlock::text();
            local_88._16_8_ = local_f8.size;
            local_88._8_8_ = local_f8.ptr;
            local_88._0_8_ = local_f8.d;
            local_f8.d = (Data *)0x0;
            local_f8.ptr = (char16_t *)0x0;
            local_f8.size = 0;
            local_88._24_2_ = 10;
            operator+=((QString *)&local_68,(QStringBuilder<QString,_char16_t> *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
            QTextCursor::movePosition((MoveOperation)&tmpCursor,0x10,0);
          }
          QTextBlock::text();
          local_f8.d = (Data *)local_88._16_8_;
          local_f8.ptr = (char16_t *)local_88._8_8_;
          QVar9 = QStringView::mid((QStringView *)&local_f8,0,(long)(iVar1 - iVar2));
          QString::append((QChar *)&local_68,(longlong)QVar9.m_data);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_68);
        }
        else {
          if (property != ImTextAfterCursor) {
            if (property == ImCursorRectangle) {
              cursorRect(&local_b8,this);
              this_00 = (QWidgetTextControlPrivate *)this;
              goto LAB_00481bfe;
            }
            goto LAB_00481ae1;
          }
          lVar8 = 0x400;
          if (3 < *(ulong *)(in_RCX + 0x18)) {
            iVar5 = ::QVariant::toInt(in_RCX);
            lVar8 = (long)iVar5;
          }
          _tmpCursor = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor(&tmpCursor,&this_00->cursor);
          QTextCursor::position();
          QTextBlock::position();
          local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::text();
          QString::mid((longlong)&local_68,(longlong)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          while (local_68.size < lVar8) {
            iVar5 = QTextCursor::blockNumber();
            QTextCursor::movePosition((MoveOperation)&tmpCursor,0x10,0);
            iVar6 = QTextCursor::blockNumber();
            if (iVar6 == iVar5) break;
            QTextCursor::block();
            QTextBlock::text();
            local_88._24_8_ = local_f8.size;
            local_88._16_8_ = local_f8.ptr;
            local_88._8_8_ = local_f8.d;
            local_88._0_2_ = 10;
            local_f8.d = (Data *)0x0;
            local_f8.ptr = (char16_t *)0x0;
            local_f8.size = 0;
            operator+=((QString *)&local_68,(QStringBuilder<char16_t,_QString> *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_88 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          }
          ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_68);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        this_01 = (QArrayDataPointer<char16_t> *)&tmpCursor;
        goto LAB_00482042;
      }
      QTextCursor::selectedText();
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  }
LAB_00482047:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QWidgetTextControl::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QWidgetTextControl);
    QTextBlock block = d->cursor.block();
    switch(property) {
    case Qt::ImCursorRectangle:
        return cursorRect();
    case Qt::ImAnchorRectangle:
        return d->rectForPosition(d->cursor.anchor());
    case Qt::ImFont:
        return QVariant(d->cursor.charFormat().font());
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position() - block.position());
        return QVariant(d->cursor.position() - block.position()); }
    case Qt::ImSurroundingText:
        return QVariant(block.text());
    case Qt::ImCurrentSelection:
        return QVariant(d->cursor.selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(); // No limit.
    case Qt::ImAnchorPosition:
        return QVariant(d->cursor.anchor() - block.position());
    case Qt::ImAbsolutePosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position());
        return QVariant(d->cursor.position()); }
    case Qt::ImTextAfterCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        QString result = block.text().mid(localPos);
        while (result.size() < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::NextBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            result += u'\n' + tmpCursor.block().text();
        }
        return QVariant(result);
    }
    case Qt::ImTextBeforeCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        int numBlocks = 0;
        int resultLen = localPos;
        while (resultLen < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::PreviousBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            numBlocks++;
            resultLen += tmpCursor.block().length();
        }
        QString result;
        while (numBlocks) {
            result += tmpCursor.block().text() + u'\n';
            tmpCursor.movePosition(QTextCursor::NextBlock);
            --numBlocks;
        }
        result += QStringView{block.text()}.mid(0, localPos);
        return QVariant(result);
    }
    default:
        return QVariant();
    }
}